

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

uint secp256k1_scalar_get_bits_var(secp256k1_scalar *a,uint offset,uint count)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (offset + count) - 1 >> 6;
  uVar3 = offset >> 6;
  if (uVar2 == uVar3) {
    uVar2 = (uint)(a->d[uVar2] >> ((byte)offset & 0x3f));
  }
  else {
    bVar1 = (byte)offset & 0x3f;
    uVar2 = (uint)(a->d[uVar3] >> bVar1) | (uint)(a->d[(ulong)uVar3 + 1] << 0x40 - bVar1);
  }
  return uVar2 & ~(uint)(-1L << ((byte)count & 0x3f));
}

Assistant:

SECP256K1_INLINE static unsigned int secp256k1_scalar_get_bits_var(const secp256k1_scalar *a, unsigned int offset, unsigned int count) {
    VERIFY_CHECK(count < 32);
    VERIFY_CHECK(offset + count <= 256);
    if ((offset + count - 1) >> 6 == offset >> 6) {
        return secp256k1_scalar_get_bits(a, offset, count);
    } else {
        VERIFY_CHECK((offset >> 6) + 1 < 4);
        return ((a->d[offset >> 6] >> (offset & 0x3F)) | (a->d[(offset >> 6) + 1] << (64 - (offset & 0x3F)))) & ((((uint64_t)1) << count) - 1);
    }
}